

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseDocument(TidyDocImpl *doc)

{
  NodeType NVar1;
  ulong uVar2;
  Node *pNVar3;
  bool bVar4;
  Bool BVar5;
  int iVar6;
  Node *pNVar7;
  Node *pNVar8;
  AttVal *pAVar9;
  Node *pNVar10;
  Node **ppNVar11;
  Node **ppNVar12;
  
  ppNVar12 = &(doc->root).content;
  bVar4 = true;
LAB_00141498:
  pNVar7 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar7 != (Node *)0x0) {
    if (pNVar7->type != XmlDecl) goto LAB_001414f4;
    doc->xmlDetected = yes;
    pNVar8 = prvTidyFindXmlDecl(doc);
    if ((pNVar8 == (Node *)0x0) || (*ppNVar12 == (Node *)0x0)) {
      if ((1 < pNVar7->line) || (pNVar7->column != 1)) {
        prvTidyReport(doc,&doc->root,pNVar7,0x275);
      }
      goto LAB_001414f4;
    }
    goto LAB_0014150c;
  }
LAB_00141696:
  if ((doc->config).value[1].v != 0) {
    prvTidyAccessibilityChecks(doc);
  }
  pNVar7 = prvTidyFindHTML(doc);
  if (pNVar7 == (Node *)0x0) {
    pNVar8 = prvTidyInferredTag(doc,TidyTag_HTML);
    pNVar8->parent = &doc->root;
    pNVar7 = (doc->root).last;
    pNVar8->prev = pNVar7;
    ppNVar11 = &pNVar7->next;
    if (pNVar7 == (Node *)0x0) {
      ppNVar11 = ppNVar12;
    }
    *ppNVar11 = pNVar8;
    (doc->root).last = pNVar8;
    prvTidyParseHTML(doc,pNVar8,IgnoreWhitespace);
  }
  pNVar7 = prvTidyFindTITLE(doc);
  if (pNVar7 == (Node *)0x0) {
    pNVar7 = prvTidyFindHEAD(doc);
    if (*(int *)((doc->config).value + 6) != 1) {
      prvTidyReport(doc,pNVar7,(Node *)0x0,0x262);
    }
    pNVar10 = prvTidyInferredTag(doc,TidyTag_TITLE);
    pNVar10->parent = pNVar7;
    pNVar8 = pNVar7->last;
    pNVar10->prev = pNVar8;
    ppNVar12 = &pNVar8->next;
    if (pNVar8 == (Node *)0x0) {
      ppNVar12 = &pNVar7->content;
    }
    *ppNVar12 = pNVar10;
    pNVar7->last = pNVar10;
  }
  AttributeChecks(doc,&doc->root);
  ReplaceObsoleteElements(doc,&doc->root);
  prvTidyDropEmptyElements(doc,&doc->root);
  CleanSpaces(doc,&doc->root);
  if (*(int *)((doc->config).value + 0x17) != 0) {
    pNVar7 = prvTidyFindBody(doc);
    if (pNVar7 != (Node *)0x0) {
      pNVar7 = pNVar7->content;
      while (pNVar7 != (Node *)0x0) {
        BVar5 = prvTidynodeIsText(pNVar7);
        if (BVar5 == no) {
LAB_001417c1:
          BVar5 = prvTidynodeIsElement(pNVar7);
          if (BVar5 != no) {
            BVar5 = nodeCMIsOnlyInline(pNVar7);
            if (BVar5 != no) goto LAB_001417dd;
          }
          pNVar7 = pNVar7->next;
        }
        else {
          BVar5 = prvTidyIsBlank(doc->lexer,pNVar7);
          if (BVar5 != no) goto LAB_001417c1;
LAB_001417dd:
          pNVar8 = prvTidyInferredTag(doc,TidyTag_P);
          prvTidyInsertNodeBeforeElement(pNVar7,pNVar8);
          while (pNVar7 != (Node *)0x0) {
            BVar5 = prvTidynodeIsElement(pNVar7);
            if (BVar5 != no) {
              BVar5 = nodeCMIsOnlyInline(pNVar7);
              if (BVar5 == no) break;
            }
            pNVar10 = pNVar7->next;
            prvTidyRemoveNode(pNVar7);
            pNVar7->parent = pNVar8;
            pNVar3 = pNVar8->last;
            ppNVar12 = &pNVar3->next;
            if (pNVar3 == (Node *)0x0) {
              ppNVar12 = &pNVar8->content;
            }
            pNVar7->prev = pNVar3;
            *ppNVar12 = pNVar7;
            pNVar8->last = pNVar7;
            pNVar7 = pNVar10;
          }
          TrimSpaces(doc,pNVar8);
        }
      }
    }
  }
  if (*(int *)((doc->config).value + 0x16) != 0) {
    EncloseBlockText(doc,&doc->root);
    return;
  }
  return;
LAB_001414f4:
  BVar5 = InsertMisc(&doc->root,pNVar7);
  if (BVar5 != no) goto LAB_00141498;
  NVar1 = pNVar7->type;
  if (NVar1 == EndTag) {
LAB_0014150c:
    prvTidyReport(doc,&doc->root,pNVar7,0x235);
    prvTidyFreeNode(doc,pNVar7);
    goto LAB_00141498;
  }
  if (NVar1 == StartTag) {
    if (pNVar7->tag == (Dict *)0x0) goto LAB_0014160f;
    if (pNVar7->tag->id == TidyTag_HTML) {
      pAVar9 = prvTidyAttrGetById(pNVar7,TidyAttr_XMLNS);
      if ((pAVar9 != (AttVal *)0x0) && (pAVar9->value != (ctmbstr)0x0)) {
        iVar6 = prvTidytmbstrcasecmp(pAVar9->value,"http://www.w3.org/1999/xhtml");
        if (iVar6 == 0) {
          iVar6 = *(int *)((doc->config).value + 0x21);
          doc->lexer->isvoyager = yes;
          BVar5 = (Bool)(iVar6 == 0);
          prvTidySetOptionBool(doc,TidyXhtmlOut,BVar5);
          prvTidySetOptionBool(doc,TidyXmlOut,BVar5);
          if (iVar6 == 0) {
            prvTidySetOptionBool(doc,TidyUpperCaseTags,no);
            prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
          }
        }
      }
    }
    if (((pNVar7->type != StartTag) || (pNVar7->tag == (Dict *)0x0)) ||
       (pNVar7->tag->id != TidyTag_HTML)) goto LAB_0014160f;
  }
  else {
    if (NVar1 == DocTypeTag) {
      if (bVar4) {
        pNVar7->parent = &doc->root;
        pNVar8 = (doc->root).last;
        ppNVar11 = &pNVar8->next;
        if (pNVar8 == (Node *)0x0) {
          ppNVar11 = ppNVar12;
        }
        pNVar7->prev = pNVar8;
        *ppNVar11 = pNVar7;
        (doc->root).last = pNVar7;
        bVar4 = false;
        goto LAB_00141498;
      }
      goto LAB_0014150c;
    }
LAB_0014160f:
    prvTidyUngetToken(doc);
    pNVar7 = prvTidyInferredTag(doc,TidyTag_HTML);
  }
  pNVar8 = prvTidyFindDocType(doc);
  if (pNVar8 == (Node *)0x0) {
    uVar2 = (doc->config).value[0xe].v;
    if (uVar2 != 1) {
      if (*(int *)((doc->config).value + 6) != 1) {
        prvTidyReport(doc,(Node *)0x0,(Node *)0x0,600);
      }
      if ((uVar2 & 0xfffffffffffffffd) == 0) goto LAB_0014166c;
    }
    prvTidyAdjustTags(doc);
  }
LAB_0014166c:
  pNVar7->parent = &doc->root;
  pNVar8 = (doc->root).last;
  pNVar7->prev = pNVar8;
  ppNVar11 = &pNVar8->next;
  if (pNVar8 == (Node *)0x0) {
    ppNVar11 = ppNVar12;
  }
  *ppNVar11 = pNVar7;
  (doc->root).last = pNVar7;
  prvTidyParseHTML(doc,pNVar7,IgnoreWhitespace);
  goto LAB_00141696;
}

Assistant:

void TY_(ParseDocument)(TidyDocImpl* doc)
{
    Node *node, *html, *doctype = NULL;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->type == XmlDecl)
        {
            doc->xmlDetected = yes;

            if (TY_(FindXmlDecl)(doc) && doc->root.content)
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->line > 1 || node->column != 1)
            {
                TY_(Report)(doc, &doc->root, node, SPACE_PRECEDING_XMLDECL);
            }
        }

        /* deal with comments etc. */
        if (InsertMisc( &doc->root, node ))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if (node->type == StartTag && nodeIsHTML(node))
        {
            AttVal *xmlns;

            xmlns = TY_(AttrGetById)(node, TidyAttr_XMLNS);

            if (AttrValueIs(xmlns, XHTML_NAMESPACE))
            {
                Bool htmlOut = cfgBool( doc, TidyHtmlOut );
                doc->lexer->isvoyager = yes;                  /* Unless plain HTML */
                TY_(SetOptionBool)( doc, TidyXhtmlOut, !htmlOut ); /* is specified, output*/
                TY_(SetOptionBool)( doc, TidyXmlOut, !htmlOut );   /* will be XHTML. */

                /* adjust other config options, just as in config.c */
                if ( !htmlOut )
                {
                    TY_(SetOptionBool)( doc, TidyUpperCaseTags, no );
                    TY_(SetOptionInt)( doc, TidyUpperCaseAttrs, no );
                }
            }
        }

        if ( node->type != StartTag || !nodeIsHTML(node) )
        {
            TY_(UngetToken)( doc );
            html = TY_(InferredTag)(doc, TidyTag_HTML);
        }
        else
            html = node;

        /*\
         *  #72, avoid MISSING_DOCTYPE if show-body-only. 
         *  #191, also if --doctype omit, that is TidyDoctypeOmit
         *  #342, adjust tags to html4-- if not 'auto' or 'html5'
        \*/
        if (!TY_(FindDocType)(doc)) 
        {
            ulong dtmode = cfg( doc, TidyDoctypeMode );
            if ((dtmode != TidyDoctypeOmit) && !showingBodyOnly(doc))
                TY_(Report)(doc, NULL, NULL, MISSING_DOCTYPE);
            if ((dtmode != TidyDoctypeAuto) && (dtmode != TidyDoctypeHtml5))
            {
                /*\
                 *  Issue #342 - if not doctype 'auto', or 'html5'
                 *  then reset mode htm4-- parsing
                \*/
                TY_(AdjustTags)(doc); /* Dynamically modify the tags table to html4-- mode */
            }
        }
        TY_(InsertNodeAtEnd)( &doc->root, html);
        TY_(ParseHTML)( doc, html, IgnoreWhitespace );
        break;
    }

    /* do this before any more document fixes */
    if ( cfg( doc, TidyAccessibilityCheckLevel ) > 0 )
        TY_(AccessibilityChecks)( doc );

    if (!TY_(FindHTML)(doc))
    {
        /* a later check should complain if <body> is empty */
        html = TY_(InferredTag)(doc, TidyTag_HTML);
        TY_(InsertNodeAtEnd)( &doc->root, html);
        TY_(ParseHTML)(doc, html, IgnoreWhitespace);
    }

    if (!TY_(FindTITLE)(doc))
    {
        Node* head = TY_(FindHEAD)(doc);
        /* #72, avoid MISSING_TITLE_ELEMENT if show-body-only (but allow InsertNodeAtEnd to avoid new warning) */
        if (!showingBodyOnly(doc))
        {
            TY_(Report)(doc, head, NULL, MISSING_TITLE_ELEMENT);
        }
        TY_(InsertNodeAtEnd)(head, TY_(InferredTag)(doc, TidyTag_TITLE));
    }

    AttributeChecks(doc, &doc->root);
    ReplaceObsoleteElements(doc, &doc->root);
    TY_(DropEmptyElements)(doc, &doc->root);
    CleanSpaces(doc, &doc->root);

    if (cfgBool(doc, TidyEncloseBodyText))
        EncloseBodyText(doc);
    if (cfgBool(doc, TidyEncloseBlockText))
        EncloseBlockText(doc, &doc->root);
}